

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

char * CVmObjBigNum::parse_str_alo(size_t *buflen,char *str,size_t len,int radix)

{
  int iVar1;
  size_t sVar2;
  char *prec_00;
  undefined4 in_ECX;
  size_t *in_RDI;
  char *ext;
  int prec;
  int in_stack_0000003c;
  size_t in_stack_00000040;
  char *in_stack_00000048;
  char *in_stack_00000050;
  
  iVar1 = precision_from_string(str,len,radix);
  sVar2 = calc_alloc((long)iVar1);
  *in_RDI = sVar2;
  prec_00 = (char *)operator_new__(sVar2);
  set_prec((char *)CONCAT44(in_ECX,iVar1),(size_t)prec_00);
  parse_str_into(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c);
  return prec_00;
}

Assistant:

char *CVmObjBigNum::parse_str_alo(size_t &buflen,
                                  const char *str, size_t len, int radix)
{
    /* figure the precision */
    int prec = precision_from_string(str, len, radix);

    /* allocate a buffer */
    char *ext = new char[buflen = calc_alloc(prec)];
    set_prec(ext, prec);

    /* parse the number */
    parse_str_into(ext, str, len, radix);

    /* return the new buffer */
    return ext;
}